

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDsdFilter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  If_DsdMan_t *p;
  If_DsdMan_t *pMan;
  char *pcVar6;
  char *pcVar7;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_3c;
  
  local_58 = 0;
  p = (If_DsdMan_t *)Abc_FrameReadManDsd();
  Extra_UtilGetoptReset();
  local_5c = 0xffffffff;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_54 = 0;
  local_50 = 0;
  local_4c = 0;
  local_3c = 0;
  do {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"LKomiutsvh"), iVar4 = globalUtilOptind, 0x68 < iVar5)
    {
      switch(iVar5) {
      case 0x69:
        bVar3 = (bool)(bVar3 ^ 1);
        break;
      default:
        goto switchD_002655e8_caseD_6a;
      case 0x6d:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 0x6f:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x73:
        local_4c = local_4c ^ 1;
        break;
      case 0x74:
        local_50 = local_50 ^ 1;
        break;
      case 0x75:
        local_54 = local_54 ^ 1;
        break;
      case 0x76:
        local_3c = local_3c ^ 1;
      }
    }
    if (iVar5 == 0x4b) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-K\" should be followed by a floating point number.\n";
LAB_002656fd:
        Abc_Print(-1,pcVar6);
switchD_002655e8_caseD_6a:
        Abc_Print(-2,"usage: dsd_filter [-LK num] [-omiutsvh]\n");
        Abc_Print(-2,"\t         filtering structured and modifying parameters of DSD manager\n");
        Abc_Print(-2,
                  "\t-L num : remove structures with fewer occurrences that this [default = %d]\n",
                  (ulong)local_58);
        Abc_Print(-2,"\t-K num : new LUT size to set for the DSD manager [default = %d]\n",
                  (ulong)local_5c);
        pcVar7 = "yes";
        pcVar6 = "yes";
        if (!bVar1) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-o     : toggles cleaning occurrence counters [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (!bVar2) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-m     : toggles cleaning matching marks [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (!bVar3) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-i     : toggles inverting matching marks [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_54 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-u     : toggles marking unate functions [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_50 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-t     : toggles marking threshold functions [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_4c == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-s     : toggles marking threshold functions heuristically [default = %s]\n"
                  ,pcVar6);
        if (local_3c == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar7);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        Abc_Print(-2,"\t        \n");
        Abc_Print(-2,
                  "\t         Option \"dsd_filter -s\" was contributed by Augusto Neutzling and Jody Matos from\n"
                 );
        Abc_Print(-2,
                  "\t         Federal University of Rio Grande do Sul, Brazil. The paper describing the method:\n"
                 );
        Abc_Print(-2,"\t         A. Neutzling, J. M. Matos, A. Mishchenko, R. Ribas, and A. Reis,\n"
                 );
        Abc_Print(-2,
                  "\t         \"Threshold logic synthesis based on cut pruning\". Proc. ICCAD 2015.\n"
                 );
        return 1;
      }
      local_5c = atoi(argv[globalUtilOptind]);
    }
    else {
      if (iVar5 != 0x4c) {
        if (iVar5 == -1) {
          if (p == (If_DsdMan_t *)0x0) {
            Abc_Print(-1,"The DSD manager is not started.\n");
            return 0;
          }
          if (0 < (int)local_58) {
            pMan = If_DsdManFilter(p,local_58);
            Abc_FrameSetManDsd(pMan);
          }
          if (-1 < (int)local_5c) {
            If_DsdManSetLutSize(p,local_5c);
          }
          if (bVar1) {
            If_DsdManCleanOccur(p,local_3c);
          }
          if (bVar2) {
            If_DsdManCleanMarks(p,local_3c);
          }
          if (bVar3) {
            If_DsdManInvertMarks(p,local_3c);
            return 0;
          }
          if (local_58 != 0) {
            return 0;
          }
          Id_DsdManTuneThresh(p,local_54,local_50,local_4c,local_3c);
          return 0;
        }
        goto switchD_002655e8_caseD_6a;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-L\" should be followed by a floating point number.\n";
        goto LAB_002656fd;
      }
      local_58 = atoi(argv[globalUtilOptind]);
    }
    globalUtilOptind = iVar4 + 1;
  } while( true );
}

Assistant:

int Abc_CommandDsdFilter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    If_DsdMan_t * pDsd = (If_DsdMan_t *)Abc_FrameReadManDsd();
    int c, nLimit = 0, nLutSize = -1, fCleanOccur = 0, fCleanMarks = 0, fInvMarks = 0, fUnate = 0, fThresh = 0, fThreshHeuristic = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LKomiutsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a floating point number.\n" );
                goto usage;
            }
            nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a floating point number.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'o':
            fCleanOccur ^= 1;
            break;
        case 'm':
            fCleanMarks ^= 1;
            break;
        case 'i':
            fInvMarks ^= 1;
            break;
        case 'u':
            fUnate ^= 1;
            break;
        case 't':
            fThresh ^= 1;
            break;
        case 's':
            fThreshHeuristic ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pDsd == NULL )
    {
        Abc_Print( -1, "The DSD manager is not started.\n" );
        return 0;
    }
    if ( nLimit > 0 )
        Abc_FrameSetManDsd( If_DsdManFilter(pDsd, nLimit) );
    if ( nLutSize >= 0 )
        If_DsdManSetLutSize( pDsd, nLutSize );
    if ( fCleanOccur )
        If_DsdManCleanOccur( pDsd, fVerbose );
    if ( fCleanMarks )
        If_DsdManCleanMarks( pDsd, fVerbose );
    if ( fInvMarks )
        If_DsdManInvertMarks( pDsd, fVerbose );
#ifdef ABC_USE_CUDD
    else if ( nLimit == 0 )
        Id_DsdManTuneThresh( pDsd, fUnate, fThresh, fThreshHeuristic, fVerbose );
#endif
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_filter [-LK num] [-omiutsvh]\n" );
    Abc_Print( -2, "\t         filtering structured and modifying parameters of DSD manager\n" );
    Abc_Print( -2, "\t-L num : remove structures with fewer occurrences that this [default = %d]\n", nLimit );
    Abc_Print( -2, "\t-K num : new LUT size to set for the DSD manager [default = %d]\n",           nLutSize );
    Abc_Print( -2, "\t-o     : toggles cleaning occurrence counters [default = %s]\n",              fCleanOccur? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles cleaning matching marks [default = %s]\n",                   fCleanMarks? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggles inverting matching marks [default = %s]\n",                  fInvMarks? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggles marking unate functions [default = %s]\n",                   fUnate? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggles marking threshold functions [default = %s]\n",               fThresh? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles marking threshold functions heuristically [default = %s]\n", fThreshHeuristic?"yes":"no");
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n",                            fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t        \n" );
    Abc_Print( -2, "\t         Option \"dsd_filter -s\" was contributed by Augusto Neutzling and Jody Matos from\n" );
    Abc_Print( -2, "\t         Federal University of Rio Grande do Sul, Brazil. The paper describing the method:\n" );
    Abc_Print( -2, "\t         A. Neutzling, J. M. Matos, A. Mishchenko, R. Ribas, and A. Reis,\n" );
    Abc_Print( -2, "\t         \"Threshold logic synthesis based on cut pruning\". Proc. ICCAD 2015.\n" );
//    Abc_Print( -2, "\t        http://www.eecs.berkeley.edu/~alanmi/publications/2015/iccad15_thresh.pdf\n" );
    return 1;
}